

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zuker.cpp
# Opt level: O3

void __thiscall
Zuker::lambda_swipe_3(Zuker *this,double threshold,double threshold2,ostream *fout,string *outfile)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  const_iterator cVar4;
  mapped_type *pmVar5;
  long lVar6;
  ostream *poVar7;
  pointer pbVar8;
  double right_lambda;
  double left_lambda;
  double left_O;
  string left_rna;
  double right_mfe;
  double right_cai;
  double left_mfe;
  double left_cai;
  double right_CAI;
  double left_CAI;
  queue<std::pair<double,_double>,_std::deque<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  lambda;
  vector<double,_std::allocator<double>_> C_buffer;
  vector<double,_std::allocator<double>_> MFE_buffer;
  vector<double,_std::allocator<double>_> stand_CAI;
  vector<double,_std::allocator<double>_> CAI_buffer;
  vector<double,_std::allocator<double>_> F_buffer;
  vector<double,_std::allocator<double>_> lambda_buffer;
  vector<double,_std::allocator<double>_> O_buffer;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  dataset;
  string right_rna;
  string right_bp;
  string left_bp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
  cai_map;
  unordered_map<double,_double,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_double>_>_>
  mfe_map;
  double local_300;
  double local_2f8;
  pair<double,_double> local_2f0;
  mapped_type local_2e0;
  undefined1 local_2d8 [16];
  char local_2c8 [16];
  double local_2b8;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  double local_298;
  double local_290;
  double local_288;
  vector<int,_std::allocator<int>_> *local_280;
  _Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_278;
  vector<double,_std::allocator<double>_> local_228;
  vector<double,_std::allocator<double>_> local_208;
  vector<double,_std::allocator<double>_> local_1e8;
  vector<double,_std::allocator<double>_> local_1c8;
  vector<double,_std::allocator<double>_> local_1a8;
  vector<double,_std::allocator<double>_> local_188;
  vector<double,_std::allocator<double>_> local_168;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  local_150;
  string local_138;
  char *local_118;
  long local_110;
  char local_108 [16];
  char *local_f8;
  long local_f0;
  char local_e8 [16];
  string *local_d8;
  double local_d0;
  double local_c8;
  string local_c0;
  _Hashtable<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a0;
  _Hashtable<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_d8 = outfile;
  local_d0 = threshold2;
  local_c8 = threshold;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::vector(&local_150,7,(allocator_type *)&local_278);
  local_278._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_278._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_278._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_278._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_278._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_278._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_278._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_278._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_278._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_278._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  _M_initialize_map(&local_278,0);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_a0._M_buckets = &local_a0._M_single_bucket;
  local_a0._M_bucket_count = 1;
  local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a0._M_element_count = 0;
  local_a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_a0._M_rehash_policy._M_next_resize = 0;
  local_a0._M_single_bucket = (__node_base_ptr)0x0;
  local_288 = 0.0;
  local_298 = 0.0;
  local_2a0 = 0.0;
  local_290 = 10000000.0;
  local_2a8 = 10000000.0;
  local_2b0 = 10000000.0;
  local_2d8._0_8_ = (char *)0x3ee4f8b588e368f1;
  local_2d8._8_8_ = (pointer)0x3fefffeb074a771d;
  if (local_278._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_278._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    _M_push_back_aux<std::pair<double,double>>
              ((deque<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               &local_278,(pair<double,_double> *)local_2d8);
  }
  else {
    (local_278._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = 1e-05;
    (local_278._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = 0.99999;
    local_278._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_278._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_278._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_278._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_280 = &this->protein;
    do {
      local_2f8 = (local_278._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
      local_300 = (local_278._M_impl.super__Deque_impl_data._M_start._M_cur)->second;
      if (local_278._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_278._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_278._M_impl.super__Deque_impl_data._M_start._M_first);
        local_278._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_278._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_278._M_impl.super__Deque_impl_data._M_start._M_last =
             local_278._M_impl.super__Deque_impl_data._M_start._M_cur + 0x20;
        local_278._M_impl.super__Deque_impl_data._M_start._M_first =
             local_278._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_278._M_impl.super__Deque_impl_data._M_start._M_node =
             local_278._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_278._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_278._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      local_2d8._0_8_ = local_2c8;
      std::__cxx11::string::_M_construct((ulong)local_2d8,(char)this->n * '\x03');
      local_f8 = local_e8;
      std::__cxx11::string::_M_construct((ulong)&local_f8,(char)this->n * '\x03');
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_138,(char)this->n * '\x03');
      local_118 = local_108;
      std::__cxx11::string::_M_construct((ulong)&local_118,(char)this->n * '\x03');
      cVar4 = std::
              _Hashtable<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&local_68,&local_2f8);
      if (cVar4.super__Node_iterator_base<std::pair<const_double,_double>,_false>._M_cur ==
          (__node_type *)0x0) {
        reinit(this);
        std::__ostream_insert<char,std::char_traits<char>>(fout,"lambda: ",8);
        poVar7 = std::ostream::_M_insert<double>(local_2f8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        local_2f0.first = calculate_CAI_O(this,fout,local_2f8);
        traceback_B2(this,local_2f8);
        get_rna_cai(this,(string *)local_2d8);
        pbVar8 = (this->bp_bond).super__Vector_base<bond,_std::allocator<bond>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (0 < pbVar8->i) {
          lVar6 = 0;
          do {
            local_f8[pbVar8[lVar6 + 1].i] = '(';
            local_f8[(this->bp_bond).super__Vector_base<bond,_std::allocator<bond>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar6 + 1].j] = ')';
            pbVar8 = (this->bp_bond).super__Vector_base<bond,_std::allocator<bond>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar6 = lVar6 + 1;
          } while (lVar6 < pbVar8->i);
        }
        local_288 = evaluate_CAI((string *)local_2d8,local_280,1);
        local_298 = evaluate_CAI((string *)local_2d8,local_280,0);
        local_2e0 = evaluate_MFE((string *)local_2d8);
        local_2a0 = local_2e0;
        pmVar5 = std::__detail::
                 _Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_68,&local_2f8);
        *pmVar5 = local_2e0;
        local_2e0 = local_298;
        pmVar5 = std::__detail::
                 _Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_a0,&local_2f8);
        *pmVar5 = local_2e0;
        if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_168,
                     (iterator)
                     local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_2f0.first);
        }
        else {
          *local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_2f0.first;
          local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_188,
                     (iterator)
                     local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_2f8);
        }
        else {
          *local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_2f8;
          local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_1a8,
                     (iterator)
                     local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_2a0);
        }
        else {
          *local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_2a0;
          local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_1c8,
                     (iterator)
                     local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_288);
        }
        else {
          *local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_288;
          local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_1e8,
                     (iterator)
                     local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_298);
        }
        else {
          *local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_298;
          local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        lVar6 = (long)this->n;
        iVar3 = (this->start_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6 + -1] + this->minY +
                (this->index_offset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6 + -1] * 2 +
                n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start
                [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar6 + -1]] * this->minX;
        local_2b8 = (this->Z2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar3] / local_2f8;
        if (local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_208,
                     (iterator)
                     local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_2b8);
        }
        else {
          *local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_2b8;
          local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_2b8 = (this->Z_CAI).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar3] / (local_2f8 + -1.0);
        if (local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_228,
                     (iterator)
                     local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_2b8);
        }
        else {
          *local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_2b8;
          local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        std::__ostream_insert<char,std::char_traits<char>>(fout,"rna: ",5);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (fout,(char *)local_2d8._0_8_,local_2d8._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(fout,"bp: ",4);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>(fout,local_f8,local_f0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"lambda: ",8);
        poVar7 = std::ostream::_M_insert<double>(local_2f8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",O: ",4);
        poVar7 = std::ostream::_M_insert<double>(local_2f0.first);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",cai: ",6);
        poVar7 = std::ostream::_M_insert<double>
                           ((this->Z_CAI).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[iVar3] / (local_2f8 + -1.0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",mfe: ",6);
        poVar7 = std::ostream::_M_insert<double>
                           ((this->Z2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar3] / local_2f8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",integrated: ",0xd);
        poVar7 = std::ostream::_M_insert<double>
                           ((this->Z2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar3] +
                            (this->Z_CAI).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[iVar3]);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"lambda: ",8);
        poVar7 = std::ostream::_M_insert<double>(local_2f8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",O: ",4);
        poVar7 = std::ostream::_M_insert<double>(local_2f0.first);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",cai: ",6);
        poVar7 = std::ostream::_M_insert<double>(local_288);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",sCAI: ",7);
        poVar7 = std::ostream::_M_insert<double>(local_298);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",mfe: ",6);
        poVar7 = std::ostream::_M_insert<double>(local_2a0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",combined: ",0xb);
        poVar7 = std::ostream::_M_insert<double>
                           (local_2f8 * local_2a0 + (local_2f8 + -1.0) * local_288);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
      else {
        pmVar5 = std::__detail::
                 _Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_a0,&local_2f8);
        local_298 = *pmVar5;
        pmVar5 = std::__detail::
                 _Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_68,&local_2f8);
        local_2a0 = *pmVar5;
      }
      cVar4 = std::
              _Hashtable<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&local_68,&local_300);
      if (cVar4.super__Node_iterator_base<std::pair<const_double,_double>,_false>._M_cur ==
          (__node_type *)0x0) {
        reinit(this);
        std::__ostream_insert<char,std::char_traits<char>>(fout,"lambda: ",8);
        poVar7 = std::ostream::_M_insert<double>(local_300);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        local_2f0.first = calculate_CAI_O(this,fout,local_300);
        traceback_B2(this,local_300);
        get_rna_cai(this,&local_138);
        pbVar8 = (this->bp_bond).super__Vector_base<bond,_std::allocator<bond>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (0 < pbVar8->i) {
          lVar6 = 0;
          do {
            local_118[pbVar8[lVar6 + 1].i] = '(';
            local_118[(this->bp_bond).super__Vector_base<bond,_std::allocator<bond>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar6 + 1].j] = ')';
            pbVar8 = (this->bp_bond).super__Vector_base<bond,_std::allocator<bond>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar6 = lVar6 + 1;
          } while (lVar6 < pbVar8->i);
        }
        local_290 = evaluate_CAI(&local_138,local_280,1);
        local_2a8 = evaluate_CAI(&local_138,local_280,0);
        local_2e0 = evaluate_MFE(&local_138);
        local_2b0 = local_2e0;
        pmVar5 = std::__detail::
                 _Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_68,&local_300);
        *pmVar5 = local_2e0;
        local_2e0 = local_2a8;
        pmVar5 = std::__detail::
                 _Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_a0,&local_300);
        *pmVar5 = local_2e0;
        if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_168,
                     (iterator)
                     local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_2f0.first);
        }
        else {
          *local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_2f0.first;
          local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_188,
                     (iterator)
                     local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_300);
        }
        else {
          *local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_300;
          local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_1a8,
                     (iterator)
                     local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_2b0);
        }
        else {
          *local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_2b0;
          local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_1c8,
                     (iterator)
                     local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_290);
        }
        else {
          *local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_290;
          local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_1e8,
                     (iterator)
                     local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_2a8);
        }
        else {
          *local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_2a8;
          local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        lVar6 = (long)this->n;
        iVar3 = (this->start_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6 + -1] + this->minY +
                (this->index_offset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6 + -1] * 2 +
                n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start
                [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar6 + -1]] * this->minX;
        local_2b8 = (this->Z2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar3] / local_300;
        if (local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_208,
                     (iterator)
                     local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_2b8);
        }
        else {
          *local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_2b8;
          local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_2b8 = (this->Z_CAI).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar3] / (local_300 + -1.0);
        if (local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_228,
                     (iterator)
                     local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_2b8);
        }
        else {
          *local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_2b8;
          local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        std::__ostream_insert<char,std::char_traits<char>>(fout,"rna: ",5);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (fout,local_138._M_dataplus._M_p,local_138._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(fout,"bp: ",4);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>(fout,local_118,local_110);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"lambda: ",8);
        poVar7 = std::ostream::_M_insert<double>(local_300);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",O: ",4);
        poVar7 = std::ostream::_M_insert<double>(local_2f0.first);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",cai: ",6);
        poVar7 = std::ostream::_M_insert<double>
                           ((this->Z_CAI).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[iVar3] / (local_300 + -1.0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",mfe: ",6);
        poVar7 = std::ostream::_M_insert<double>
                           ((this->Z2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar3] / local_300);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",integrated: ",0xd);
        poVar7 = std::ostream::_M_insert<double>
                           ((this->Z2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar3] +
                            (this->Z_CAI).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[iVar3]);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"lambda: ",8);
        poVar7 = std::ostream::_M_insert<double>(local_300);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",O: ",4);
        poVar7 = std::ostream::_M_insert<double>(local_2f0.first);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",cai: ",6);
        poVar7 = std::ostream::_M_insert<double>(local_290);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",sCAI: ",7);
        poVar7 = std::ostream::_M_insert<double>(local_2a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",mfe: ",6);
        poVar7 = std::ostream::_M_insert<double>(local_2b0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",combined: ",0xb);
        poVar7 = std::ostream::_M_insert<double>
                           (local_300 * local_2b0 + (local_300 + -1.0) * local_290);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
      else {
        pmVar5 = std::__detail::
                 _Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_a0,&local_300);
        local_2a8 = *pmVar5;
        pmVar5 = std::__detail::
                 _Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_68,&local_300);
        local_2b0 = *pmVar5;
      }
      bVar2 = compare(local_298,local_2a8,1e-05);
      if (!bVar2) {
        bVar2 = compare(local_2a0,local_2b0,1e-05);
        if (!bVar2) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"lamda diff: ",0xc);
          poVar7 = std::ostream::_M_insert<double>(local_300 - local_2f8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if (local_c8 <= local_300) {
            bVar2 = compare(local_2f8,local_300,local_c8);
            if (!bVar2) {
              local_2f0.first = local_2f8;
              local_2f0.second = local_2f8 * 0.4 + local_300 * 0.6;
              local_2e0 = local_2f0.second;
              if (local_278._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_278._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
                _M_push_back_aux<std::pair<double,double>>
                          ((deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                            *)&local_278,&local_2f0);
              }
              else {
                (local_278._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_2f8;
                (local_278._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
                     local_2f0.second;
                local_278._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_278._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
              local_2f0.first = local_2e0;
              local_2f0.second = local_300;
              if (local_278._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                  local_278._M_impl.super__Deque_impl_data._M_finish._M_last + -1)
              goto LAB_0013a7f7;
              std::deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
              _M_push_back_aux<std::pair<double,double>>
                        ((deque<std::pair<double,double>,std::allocator<std::pair<double,double>>> *
                         )&local_278,&local_2f0);
            }
          }
          else {
            bVar2 = compare(local_2f8,local_300,local_d0);
            if (!bVar2) {
              local_2f0.first = local_2f8;
              local_2f0.second = local_2f8 * 0.4 + local_300 * 0.6;
              local_2e0 = local_2f0.second;
              if (local_278._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_278._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
                _M_push_back_aux<std::pair<double,double>>
                          ((deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                            *)&local_278,&local_2f0);
              }
              else {
                (local_278._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_2f8;
                (local_278._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
                     local_2f0.second;
                local_278._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_278._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
              local_2f0.first = local_2e0;
              local_2f0.second = local_300;
              if (local_278._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_278._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
                _M_push_back_aux<std::pair<double,double>>
                          ((deque<std::pair<double,double>,std::allocator<std::pair<double,double>>>
                            *)&local_278,&local_2f0);
              }
              else {
LAB_0013a7f7:
                (local_278._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_2e0;
                (local_278._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = local_300;
                local_278._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_278._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                local_2f0.first = local_2e0;
                local_2f0.second = local_300;
              }
            }
          }
        }
      }
      if (local_118 != local_108) {
        operator_delete(local_118);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if (local_f8 != local_e8) {
        operator_delete(local_f8);
      }
      if ((char *)local_2d8._0_8_ != local_2c8) {
        operator_delete((void *)local_2d8._0_8_);
      }
    } while (local_278._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_278._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"size : ",7);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(fout,"left lambda: ",0xd);
  poVar7 = std::ostream::_M_insert<double>(local_2f8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,",right lambda: ",0xf);
  poVar7 = std::ostream::_M_insert<double>(local_300);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  local_2d8._0_8_ = "lambda";
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)(local_2d8 + 8),&local_188);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             local_150.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)local_2d8);
  if ((pointer)local_2d8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2d8._8_8_);
  }
  local_2d8._0_8_ = "rc_mfe";
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)(local_2d8 + 8),&local_1a8);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             (local_150.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1),
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)local_2d8);
  if ((pointer)local_2d8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2d8._8_8_);
  }
  local_2d8._0_8_ = "rc_CAI";
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)(local_2d8 + 8),&local_1c8);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             (local_150.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 2),
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)local_2d8);
  if ((pointer)local_2d8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2d8._8_8_);
  }
  local_2d8._0_8_ = "rc_sCAI";
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)(local_2d8 + 8),&local_1e8);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             (local_150.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 3),
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)local_2d8);
  if ((pointer)local_2d8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2d8._8_8_);
  }
  local_2d8[0] = 0x4f;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)(local_2d8 + 8),&local_168);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             (local_150.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 4),
             (pair<char,_std::vector<double,_std::allocator<double>_>_> *)local_2d8);
  if ((pointer)local_2d8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2d8._8_8_);
  }
  local_2d8._0_8_ = "mfe";
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)(local_2d8 + 8),&local_208);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             (local_150.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 5),
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)local_2d8);
  if ((pointer)local_2d8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2d8._8_8_);
  }
  local_2d8._0_8_ = "CAI";
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)(local_2d8 + 8),&local_228);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::string,std::vector<double,std::allocator<double>>> *)
             (local_150.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 6),
             (pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)local_2d8);
  if ((pointer)local_2d8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2d8._8_8_);
  }
  pcVar1 = (local_d8->_M_dataplus)._M_p;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar1,pcVar1 + local_d8->_M_string_length);
  std::__cxx11::string::append((char *)&local_c0);
  write_csv(&local_c0,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"swipe done",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  std::
  _Hashtable<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_a0);
  std::
  _Hashtable<double,_std::pair<const_double,_double>,_std::allocator<std::pair<const_double,_double>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  std::_Deque_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Deque_base(&local_278);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::~vector(&local_150);
  if (local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Zuker::lambda_swipe_3(double threshold, double threshold2, ostream &fout, string & outfile) {
    double left_lambda;
    double right_lambda;
    vector<double> O_buffer,lambda_buffer,F_buffer,CAI_buffer,stand_CAI;
    vector<double> MFE_buffer, C_buffer;
    vector<pair<string, vector<double>>> dataset(7);
    queue<pair<double, double>> lambda;
    unordered_map<double, double> mfe_map;
    unordered_map<double, double> cai_map;
    double left_CAI = 0, left_cai = 0, left_mfe = 0, right_CAI = inf, right_cai = inf, right_mfe = inf;

    lambda.push({EPSILON,1-EPSILON});
    int idx;

    while (!lambda.empty()) {
        left_lambda=  lambda.front().first, right_lambda = lambda.front().second;
        lambda.pop();
        string left_rna(3*n, '.'), left_bp(3*n, '.'), right_rna(3*n, '.'), right_bp(3*n, '.');
        if (mfe_map.count(left_lambda) != 0) {
            left_cai = cai_map[left_lambda];
            left_mfe = mfe_map[left_lambda];
        } else {
            reinit();
            fout << "lambda: " << left_lambda << endl;
            double left_O = calculate_CAI_O(fout,left_lambda);
            traceback_B2(left_lambda);
            get_rna_cai(left_rna);
            get_bp(left_bp);
            left_CAI = evaluate_CAI(left_rna, protein, 1);
            left_cai = evaluate_CAI(left_rna, protein, 0);
            left_mfe = evaluate_MFE(left_rna);
            mfe_map[left_lambda] = left_mfe;
            cai_map[left_lambda] = left_cai;
            O_buffer.push_back(left_O);
            lambda_buffer.push_back(left_lambda);
            F_buffer.push_back(left_mfe);
            CAI_buffer.push_back(left_CAI);
            stand_CAI.push_back(left_cai);
            idx = index(0, n-1, 0, 2, minX, minY);
            MFE_buffer.push_back(Z2[idx] / left_lambda);
            C_buffer.push_back(Z_CAI[idx] / (left_lambda-1));
            fout << "rna: " << left_rna << endl;
            fout << "bp: " << left_bp << endl;
            cout << "lambda: " << left_lambda << ",O: " << left_O << ",cai: " << Z_CAI[idx] / (left_lambda-1) << ",mfe: " << Z2[idx] / left_lambda << ",integrated: " << Z2[idx] + Z_CAI[idx] << endl;
            cout << "lambda: " << left_lambda << ",O: " << left_O << ",cai: " << left_CAI << ",sCAI: " << left_cai << ",mfe: " << left_mfe << ",combined: " << left_lambda*left_mfe+(left_lambda-1)*left_CAI << endl;

        }

        if (mfe_map.count(right_lambda) != 0) {
            right_cai = cai_map[right_lambda];
            right_mfe = mfe_map[right_lambda];
        } else {
            reinit();
            fout << "lambda: " << right_lambda << endl;
            double right_O = calculate_CAI_O(fout,right_lambda);
            traceback_B2(right_lambda);
            get_rna_cai(right_rna);
            get_bp(right_bp);
            right_CAI = evaluate_CAI(right_rna, protein, 1);
            right_cai = evaluate_CAI(right_rna, protein, 0);
            right_mfe = evaluate_MFE(right_rna);
            mfe_map[right_lambda] = right_mfe;
            cai_map[right_lambda] = right_cai;
            O_buffer.push_back(right_O);
            lambda_buffer.push_back(right_lambda);
            F_buffer.push_back(right_mfe);
            CAI_buffer.push_back(right_CAI);
            stand_CAI.push_back(right_cai);
            idx = index(0, n-1, 0, 2, minX, minY);
            MFE_buffer.push_back(Z2[idx] / right_lambda);
            C_buffer.push_back(Z_CAI[idx] / (right_lambda-1));
            fout << "rna: " << right_rna << endl;
            fout << "bp: " << right_bp << endl;
            cout << "lambda: " << right_lambda << ",O: " << right_O << ",cai: " << Z_CAI[idx] / (right_lambda-1) << ",mfe: " << Z2[idx] / right_lambda << ",integrated: " << Z2[idx] + Z_CAI[idx] << endl;
            cout << "lambda: " << right_lambda << ",O: " << right_O << ",cai: " << right_CAI << ",sCAI: " << right_cai << ",mfe: " << right_mfe << ",combined: " << right_lambda*right_mfe+(right_lambda-1)*right_CAI << endl;

        }
        if (!compare(left_cai, right_cai) && !compare(left_mfe, right_mfe)) {
            cout << "lamda diff: " << right_lambda-left_lambda << endl;
            if (right_lambda < threshold) {
                if (!compare(left_lambda,right_lambda,threshold2)) {
                    double m = left_lambda * 0.4 + right_lambda * 0.6;
                    lambda.push({left_lambda, m});
                    lambda.push({m, right_lambda});
                }
            } else {
                if (!compare(left_lambda,right_lambda,threshold)) {
                    double m = left_lambda * 0.4 + right_lambda * 0.6;
                    lambda.push({left_lambda, m});
                    lambda.push({m, right_lambda});
                }
            }

        }
    }
    cout << "size : " << lambda.size() << endl;
    fout << "left lambda: " << left_lambda << ",right lambda: " << right_lambda << endl;
    dataset[0] = make_pair("lambda", lambda_buffer);
    dataset[1] = make_pair("rc_mfe", F_buffer);
    dataset[2] = make_pair("rc_CAI", CAI_buffer);
    dataset[3] = make_pair("rc_sCAI", stand_CAI);
    dataset[4] = make_pair('O', O_buffer);
    dataset[5] = make_pair("mfe", MFE_buffer);
    dataset[6] = make_pair("CAI", C_buffer);
    write_csv(outfile + ".csv", dataset);
    cout << "swipe done" << endl;
}